

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t
flatcc_builder_create_struct(flatcc_builder_t *B,void *data,size_t size,uint16_t align)

{
  int iVar1;
  ulong uVar2;
  undefined6 in_register_0000000a;
  uint uVar3;
  int iVar4;
  bool bVar5;
  flatcc_iov_state_t iov;
  flatcc_iovec_t local_90 [8];
  
  if ((int)CONCAT62(in_register_0000000a,align) == 0) {
    __assert_fail("align >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x31e,
                  "flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *, const void *, size_t, uint16_t)"
                 );
  }
  if (B->min_align < align) {
    B->min_align = align;
  }
  iVar4 = B->emit_start;
  uVar2 = (ulong)(align - 1 & iVar4 - (int)size);
  bVar5 = size != 0;
  if (bVar5) {
    local_90[0].iov_base = data;
    local_90[0].iov_len = size;
  }
  uVar3 = (uint)bVar5;
  if (uVar2 != 0) {
    size = size + uVar2;
    local_90[bVar5].iov_base = "";
    local_90[bVar5].iov_len = uVar2;
    uVar3 = uVar3 + 1;
  }
  if ((size >> 4 < 0x10000001) && (0 < (int)size)) {
    iVar4 = iVar4 - (int)size;
    iVar1 = (*B->emit)(B->emit_context,local_90,uVar3,iVar4,size);
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x299,
                    "flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
    }
    B->emit_start = iVar4;
    return iVar4;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_struct(flatcc_builder_t *B, const void *data, size_t size, uint16_t align)
{
    size_t pad;
    iov_state_t iov;

    check(align >= 1, "align cannot be 0");
    set_min_align(B, align);
    pad = front_pad(B, (uoffset_t)size, align);
    init_iov();
    push_iov(data, size);
    /*
     * Normally structs will already be a multiple of their alignment,
     * so this padding will not likely be emitted.
     */
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}